

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

Fad<float> * __thiscall
TPZMatrix<Fad<float>_>::MatrixNorm(TPZMatrix<Fad<float>_> *this,int p,int64_t numiter,REAL tol)

{
  bool bVar1;
  int64_t iVar2;
  int64_t iVar3;
  ostream *poVar4;
  void *pvVar5;
  Fad<float> *this_00;
  long in_RCX;
  int in_EDX;
  TPZBaseMatrix *in_RSI;
  Fad<float> *in_RDI;
  float fVar6;
  double in_XMM0_Qa;
  bool result;
  TPZVec<Fad<float>_> EigenVal;
  Fad<float> sum_2;
  TPZVec<Fad<float>_> ROW;
  int64_t k;
  int64_t j_2;
  int64_t i_2;
  TPZFMatrix<Fad<float>_> transp;
  REAL sum_1;
  int64_t j_1;
  int64_t i_1;
  REAL sum;
  int64_t j;
  int64_t i;
  int64_t n;
  Fad<float> *max;
  TPZVec<Fad<float>_> *in_stack_00000450;
  REAL *in_stack_00000458;
  int64_t *in_stack_00000460;
  TPZMatrix<Fad<float>_> *in_stack_00000468;
  Fad<float> *in_stack_fffffffffffffcd8;
  Fad<float> *in_stack_fffffffffffffce0;
  double *in_stack_fffffffffffffce8;
  Fad<float> *in_stack_fffffffffffffcf0;
  int64_t in_stack_fffffffffffffcf8;
  TPZFMatrix<Fad<float>_> *in_stack_fffffffffffffd00;
  FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd17;
  Fad<float> *in_stack_fffffffffffffd18;
  Fad<float> *in_stack_fffffffffffffd20;
  Fad<float> *in_stack_fffffffffffffd38;
  TPZVec<Fad<float>_> *in_stack_fffffffffffffd40;
  double dVar7;
  int64_t in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  undefined4 in_stack_fffffffffffffd60;
  TPZVec<Fad<float>_> local_230;
  undefined1 local_210 [48];
  undefined8 local_1e0;
  TPZVec<Fad<float>_> local_1b8;
  undefined1 local_198 [32];
  int64_t local_178;
  long local_170;
  long local_168;
  undefined1 local_d0 [32];
  double local_b0;
  long local_a8;
  long local_a0;
  undefined8 local_98;
  undefined1 local_8d;
  undefined1 local_80 [32];
  double local_60;
  long local_58;
  long local_50;
  undefined8 local_48;
  undefined1 local_39;
  undefined8 local_38;
  int64_t local_30;
  double local_28;
  long local_20;
  int local_14;
  
  local_28 = in_XMM0_Qa;
  local_20 = in_RCX;
  local_14 = in_EDX;
  iVar2 = TPZBaseMatrix::Rows(in_RSI);
  local_30 = iVar2;
  if (iVar2 == 0) {
    local_38 = 0;
    Fad<float>::Fad<double,_nullptr>(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  }
  else {
    iVar3 = TPZBaseMatrix::Cols(in_RSI);
    if (iVar2 != iVar3) {
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "TVar TPZMatrix<Fad<float>>::MatrixNorm(int, int64_t, REAL) const [T = Fad<float>]"
                              );
      poVar4 = std::operator<<(poVar4," - matrix must be square - Rows() = ");
      iVar2 = TPZBaseMatrix::Rows(in_RSI);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      poVar4 = std::operator<<(poVar4," - Cols() = ");
      iVar2 = TPZBaseMatrix::Cols(in_RSI);
      pvVar5 = (void *)std::ostream::operator<<(poVar4,iVar2);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    }
    if (local_14 == 0) {
      local_39 = 0;
      local_48 = 0;
      Fad<float>::Fad<double,_nullptr>(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      for (local_50 = 0; local_50 < local_30; local_50 = local_50 + 1) {
        local_60 = 0.0;
        for (local_58 = 0; local_58 < local_30; local_58 = local_58 + 1) {
          (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x21])(local_80,in_RSI,local_50,local_58);
          fVar6 = fabs<float>((Fad<float> *)0x131e8ba);
          local_60 = (double)fVar6 + local_60;
          Fad<float>::~Fad(in_stack_fffffffffffffce0);
        }
        dVar7 = local_60;
        fVar6 = fabs<float>((Fad<float> *)0x131e965);
        if ((double)fVar6 < dVar7) {
          Fad<float>::operator=<double,_nullptr>
                    (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
        }
      }
    }
    else if (local_14 == 1) {
      local_8d = 0;
      local_98 = 0;
      Fad<float>::Fad<double,_nullptr>(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      for (local_a0 = 0; local_a0 < local_30; local_a0 = local_a0 + 1) {
        local_b0 = 0.0;
        for (local_a8 = 0; local_a8 < local_30; local_a8 = local_a8 + 1) {
          (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x21])(local_d0,in_RSI,local_a8,local_a0);
          fVar6 = fabs<float>((Fad<float> *)0x131eaa7);
          local_b0 = (double)fVar6 + local_b0;
          Fad<float>::~Fad(in_stack_fffffffffffffce0);
        }
        dVar7 = local_b0;
        fVar6 = fabs<float>((Fad<float> *)0x131eb4c);
        if ((double)fVar6 < dVar7) {
          Fad<float>::operator=<double,_nullptr>
                    (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
        }
      }
    }
    else if (local_14 == 2) {
      TPZFMatrix<Fad<float>_>::TPZFMatrix
                ((TPZFMatrix<Fad<float>_> *)CONCAT44(2,in_stack_fffffffffffffd60),
                 CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                 in_stack_fffffffffffffd50);
      for (local_168 = 0; local_168 < local_30; local_168 = local_168 + 1) {
        for (local_170 = 0; local_170 < local_30; local_170 = local_170 + 1) {
          (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x21])(local_198,in_RSI,local_170,local_168)
          ;
          in_stack_fffffffffffffd38 =
               TPZFMatrix<Fad<float>_>::operator()
                         (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                          (int64_t)in_stack_fffffffffffffcf0);
          Fad<float>::operator=(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          Fad<float>::~Fad(in_stack_fffffffffffffce0);
        }
      }
      TPZVec<Fad<float>_>::TPZVec(in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38);
      for (local_168 = 0; local_168 < local_30; local_168 = local_168 + 1) {
        for (local_170 = 0; local_170 < local_30; local_170 = local_170 + 1) {
          TPZFMatrix<Fad<float>_>::operator()
                    (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                     (int64_t)in_stack_fffffffffffffcf0);
          TPZVec<Fad<float>_>::operator[](&local_1b8,local_170);
          Fad<float>::operator=(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
        }
        for (local_170 = 0; local_170 < local_30; local_170 = local_170 + 1) {
          local_1e0 = 0;
          Fad<float>::Fad<double,_nullptr>(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
          for (local_178 = 0; local_178 < local_30; local_178 = local_178 + 1) {
            in_stack_fffffffffffffd20 = TPZVec<Fad<float>_>::operator[](&local_1b8,local_178);
            (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x21])
                      (local_210,in_RSI,local_178,local_170);
            operator*<Fad<float>,_Fad<float>,_nullptr>
                      (in_stack_fffffffffffffd18,
                       (Fad<float> *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
            Fad<float>::operator+=
                      ((Fad<float> *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                       in_stack_fffffffffffffd08);
            FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>::~FadExpr
                      ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffffce0)
            ;
            Fad<float>::~Fad(in_stack_fffffffffffffce0);
          }
          in_stack_fffffffffffffd18 =
               TPZFMatrix<Fad<float>_>::operator()
                         (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                          (int64_t)in_stack_fffffffffffffcf0);
          Fad<float>::operator=(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          Fad<float>::~Fad(in_stack_fffffffffffffce0);
        }
      }
      TPZVec<Fad<float>_>::TPZVec(&local_230);
      bVar1 = SolveEigenvaluesJacobi
                        (in_stack_00000468,in_stack_00000460,in_stack_00000458,in_stack_00000450);
      if (!bVar1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "TVar TPZMatrix<Fad<float>>::MatrixNorm(int, int64_t, REAL) const [T = Fad<float>]"
                                );
        in_stack_fffffffffffffd00 =
             (TPZFMatrix<Fad<float>_> *)
             std::operator<<(poVar4," - it was not possible to find Eigenvalues. Iterations = ");
        poVar4 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffd00,local_20);
        poVar4 = std::operator<<(poVar4," - error found = ");
        pvVar5 = (void *)std::ostream::operator<<(poVar4,local_28);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      }
      this_00 = TPZVec<Fad<float>_>::operator[](&local_230,0);
      sqrt<float>(in_stack_fffffffffffffd18);
      Fad<float>::Fad<FadFuncSqrt<Fad<float>>>
                (in_stack_fffffffffffffd20,
                 (FadExpr<FadFuncSqrt<Fad<float>_>_> *)in_stack_fffffffffffffd18);
      FadExpr<FadFuncSqrt<Fad<float>_>_>::~FadExpr((FadExpr<FadFuncSqrt<Fad<float>_>_> *)this_00);
      TPZVec<Fad<float>_>::~TPZVec((TPZVec<Fad<float>_> *)in_stack_fffffffffffffd00);
      TPZVec<Fad<float>_>::~TPZVec((TPZVec<Fad<float>_> *)in_stack_fffffffffffffd00);
      TPZFMatrix<Fad<float>_>::~TPZFMatrix((TPZFMatrix<Fad<float>_> *)0x131f177);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "TVar TPZMatrix<Fad<float>>::MatrixNorm(int, int64_t, REAL) const [T = Fad<float>]"
                              );
      poVar4 = std::operator<<(poVar4," p = ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
      poVar4 = std::operator<<(poVar4," is not a correct option");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      Fad<float>::Fad<double,_nullptr>(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    }
  }
  return in_RDI;
}

Assistant:

TVar TPZMatrix<TVar>::MatrixNorm(int p, int64_t numiter, REAL tol) const{
	const int64_t n = this->Rows();
	if (!n) return 0.;
	if (n != this->Cols()){
		PZError << __PRETTY_FUNCTION__
		<< " - matrix must be square - Rows() = "
		<< this->Rows() << " - Cols() = "
		<< this->Cols() << std::endl;
	}
	switch(p){
		case 0:{
			TVar max = 0.;
			int64_t i, j;
			for(i = 0; i < n; i++){
				REAL sum = 0.;
				for(j = 0; j < n; j++) sum += fabs( this->Get(i,j) );
				if (sum > fabs(max)) max = sum;
			}
			return max;
		}
		case 1:{
			TVar max = 0.;
			int64_t i, j;
			for(i = 0; i < n; i++){
				REAL sum = 0.;
				for(j = 0; j < n; j++) sum += fabs( this->Get(j,i) );
				if (sum > fabs(max)) max = sum;
			}
			return max;
		}
		case 2:{
			TPZFMatrix<TVar> transp(n,n);
			int64_t i, j, k;
			//TRANSPOSE
			for(i = 0; i < n; i++) for(j = 0; j < n; j++) transp(i,j) = this->Get(j,i);
			//MULTIPLY transp = transp.this
			TPZVec<TVar> ROW(n);
			for(i = 0; i < n; i++){
				for(j = 0; j < n; j++) ROW[j] = transp(i,j);
				for(j = 0; j < n; j++){
					TVar sum = 0.;
					for(k = 0; k < n; k++){
						sum += ROW[k] * this->Get(k,j);
					}//for k
					transp(i,j) = sum;
				}//for j
			}//for i
			
			TPZVec<TVar> EigenVal;
			bool result = transp.SolveEigenvaluesJacobi(numiter, tol, &EigenVal);
			if (result == false) PZError << __PRETTY_FUNCTION__
				<< " - it was not possible to find Eigenvalues. Iterations = "
				<< numiter << " - error found = " << tol << std::endl;
			return sqrt(EigenVal[0]);
		}//case 2
		default:{
			PZError << __PRETTY_FUNCTION__ << " p = " << p << " is not a correct option" << std::endl;
		}
	}//switch
	return 0.;
}